

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  int32_t iVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  Reflection *this;
  MapFieldBase *this_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  MapKey *value_00;
  size_t sVar7;
  MapValueConstRef *value_01;
  size_t sVar8;
  Descriptor *pDVar9;
  MessageOptions *this_01;
  int64_t iVar10;
  uint64_t uVar11;
  ExtensionSet *this_02;
  Message *pMVar12;
  EnumValueDescriptor *pEVar13;
  string *local_1d0;
  string *value_1;
  string scratch;
  size_t j_10;
  undefined1 local_148 [8];
  Cord value;
  size_t j_9;
  size_t j_8;
  size_t j_7;
  size_t j_6;
  size_t j_5;
  size_t j_4;
  size_t j_3;
  size_t j_2;
  size_t j_1;
  size_t j;
  size_t count;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  size_t data_size;
  Reflection *message_reflection;
  Message *message_local;
  FieldDescriptor *field_local;
  
  this = Message::GetReflection(message);
  map_field = (MapFieldBase *)0x0;
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = Reflection::GetMapData(this,message,field);
    bVar1 = MapFieldBase::IsMapValid(this_00);
    if (bVar1) {
      MapIterator::MapIterator
                ((MapIterator *)&end.value_.super_MapValueConstRef.type_,message,field);
      MapIterator::MapIterator((MapIterator *)&key_field,message,field);
      pDVar9 = FieldDescriptor::message_type(field);
      field_00 = Descriptor::field(pDVar9,0);
      pDVar9 = FieldDescriptor::message_type(field);
      field_01 = Descriptor::field(pDVar9,1);
      MapFieldBase::MapBegin(this_00,(MapIterator *)&end.value_.super_MapValueConstRef.type_);
      MapFieldBase::MapEnd(this_00,(MapIterator *)&key_field);
      while (bVar1 = protobuf::operator!=
                               ((MapIterator *)&end.value_.super_MapValueConstRef.type_,
                                (MapIterator *)&key_field), bVar1) {
        value_00 = MapIterator::GetKey((MapIterator *)&end.value_.super_MapValueConstRef.type_);
        sVar7 = MapKeyDataOnlyByteSize(field_00,value_00);
        value_01 = &MapIterator::GetValueRef
                              ((MapIterator *)&end.value_.super_MapValueConstRef.type_)->
                    super_MapValueConstRef;
        sVar8 = MapValueRefDataOnlyByteSize(field_01,value_01);
        sVar7 = WireFormatLite::LengthDelimitedSize(sVar8 + sVar7 + 2);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
        MapIterator::operator++((MapIterator *)&end.value_.super_MapValueConstRef.type_);
      }
      return (size_t)map_field;
    }
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    iVar2 = Reflection::FieldSize(this,message,field);
    j = FromIntSize(iVar2);
  }
  else {
    pDVar9 = FieldDescriptor::containing_type(field);
    this_01 = Descriptor::options(pDVar9);
    bVar1 = MessageOptions::map_entry(this_01);
    if (bVar1) {
      j = 1;
    }
    else {
      bVar1 = Reflection::HasField(this,message,field);
      j = (size_t)bVar1;
    }
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
    map_field = (MapFieldBase *)(j * 8);
    break;
  case TYPE_FLOAT:
    map_field = (MapFieldBase *)(j * 4);
    break;
  case TYPE_INT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_2 = 0; j_2 < j; j_2 = j_2 + 1) {
        iVar10 = Reflection::GetRepeatedInt64(this,message,field,(int)j_2);
        sVar7 = WireFormatLite::Int64Size(iVar10);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      iVar10 = Reflection::GetInt64(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::Int64Size(iVar10);
    }
    break;
  case TYPE_UINT64:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_6 = 0; j_6 < j; j_6 = j_6 + 1) {
        uVar11 = Reflection::GetRepeatedUInt64(this,message,field,(int)j_6);
        sVar7 = WireFormatLite::UInt64Size(uVar11);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      uVar11 = Reflection::GetUInt64(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::UInt64Size(uVar11);
    }
    break;
  case TYPE_INT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_1 = 0; j_1 < j; j_1 = j_1 + 1) {
        iVar4 = Reflection::GetRepeatedInt32(this,message,field,(int)j_1);
        sVar7 = WireFormatLite::Int32Size(iVar4);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      iVar4 = Reflection::GetInt32(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::Int32Size(iVar4);
    }
    break;
  case TYPE_FIXED64:
    map_field = (MapFieldBase *)(j * 8);
    break;
  case TYPE_FIXED32:
    map_field = (MapFieldBase *)(j * 4);
    break;
  case TYPE_BOOL:
    map_field = (MapFieldBase *)j;
    break;
  case TYPE_STRING:
  case TYPE_BYTES:
    CVar6 = FieldDescriptor::cpp_string_type(field);
    if (CVar6 == kCord) {
      for (value.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
          value.contents_.data_.rep_.field_0.as_tree.rep < j;
          value.contents_.data_.rep_.field_0.as_tree.rep =
               (CordRep *)((long)&(value.contents_.data_.rep_.field_0.as_tree.rep)->length + 1)) {
        Reflection::GetCord((Reflection *)local_148,(Message *)this,(FieldDescriptor *)message);
        sVar7 = WireFormatLite::StringSize((Cord *)local_148);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
        absl::lts_20250127::Cord::~Cord((Cord *)local_148);
      }
    }
    else {
      for (scratch.field_2._8_8_ = 0; (ulong)scratch.field_2._8_8_ < j;
          scratch.field_2._8_8_ = scratch.field_2._8_8_ + 1) {
        std::__cxx11::string::string((string *)&value_1);
        bVar1 = FieldDescriptor::is_repeated(field);
        if (bVar1) {
          local_1d0 = Reflection::GetRepeatedStringReference
                                (this,message,field,scratch.field_2._8_4_,(string *)&value_1);
        }
        else {
          local_1d0 = Reflection::GetStringReference(this,message,field,(string *)&value_1);
        }
        sVar7 = WireFormatLite::StringSize(local_1d0);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
        std::__cxx11::string::~string((string *)&value_1);
      }
    }
    break;
  case TYPE_GROUP:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_7 = 0; j_7 < j; j_7 = j_7 + 1) {
        pMVar12 = Reflection::GetRepeatedMessage(this,message,field,(int)j_7);
        sVar7 = WireFormatLite::GroupSize<google::protobuf::Message>(pMVar12);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      pMVar12 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
      map_field = (MapFieldBase *)WireFormatLite::GroupSize<google::protobuf::Message>(pMVar12);
    }
    break;
  case TYPE_MESSAGE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_8 = 0; j_8 < j; j_8 = j_8 + 1) {
        pMVar12 = Reflection::GetRepeatedMessage(this,message,field,(int)j_8);
        sVar7 = WireFormatLite::MessageSize<google::protobuf::Message>(pMVar12);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      bVar1 = FieldDescriptor::is_extension(field);
      if (bVar1) {
        this_02 = Reflection::GetExtensionSet(this,message);
        iVar2 = FieldDescriptor::number(field);
        sVar7 = ExtensionSet::GetMessageByteSizeLong(this_02,iVar2);
        map_field = (MapFieldBase *)WireFormatLite::LengthDelimitedSize(sVar7);
      }
      else {
        pMVar12 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
        map_field = (MapFieldBase *)WireFormatLite::MessageSize<google::protobuf::Message>(pMVar12);
      }
    }
    break;
  case TYPE_UINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_5 = 0; j_5 < j; j_5 = j_5 + 1) {
        uVar5 = Reflection::GetRepeatedUInt32(this,message,field,(int)j_5);
        sVar7 = WireFormatLite::UInt32Size(uVar5);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      uVar5 = Reflection::GetUInt32(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::UInt32Size(uVar5);
    }
    break;
  case TYPE_ENUM:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_9 = 0; j_9 < j; j_9 = j_9 + 1) {
        pEVar13 = Reflection::GetRepeatedEnum(this,message,field,(int)j_9);
        iVar2 = EnumValueDescriptor::number(pEVar13);
        sVar7 = WireFormatLite::EnumSize(iVar2);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      pEVar13 = Reflection::GetEnum(this,message,field);
      iVar2 = EnumValueDescriptor::number(pEVar13);
      map_field = (MapFieldBase *)WireFormatLite::EnumSize(iVar2);
    }
    break;
  case TYPE_SFIXED32:
    map_field = (MapFieldBase *)(j * 4);
    break;
  case TYPE_SFIXED64:
    map_field = (MapFieldBase *)(j * 8);
    break;
  case TYPE_SINT32:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_3 = 0; j_3 < j; j_3 = j_3 + 1) {
        iVar4 = Reflection::GetRepeatedInt32(this,message,field,(int)j_3);
        sVar7 = WireFormatLite::SInt32Size(iVar4);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      iVar4 = Reflection::GetInt32(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::SInt32Size(iVar4);
    }
    break;
  case MAX_TYPE:
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      for (j_4 = 0; j_4 < j; j_4 = j_4 + 1) {
        iVar10 = Reflection::GetRepeatedInt64(this,message,field,(int)j_4);
        sVar7 = WireFormatLite::SInt64Size(iVar10);
        map_field = (MapFieldBase *)
                    ((long)&(map_field->super_MapFieldBaseForParse).payload_._M_i + sVar7);
      }
    }
    else {
      iVar10 = Reflection::GetInt64(this,message,field);
      map_field = (MapFieldBase *)WireFormatLite::SInt64Size(iVar10);
    }
  }
  return (size_t)map_field;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (size_t j = 0; j < count; j++) {                                  \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)

    case FieldDescriptor::TYPE_MESSAGE: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; ++j) {
          data_size += WireFormatLite::MessageSize(
              message_reflection->GetRepeatedMessage(message, field, j));
        }
        break;
      }
      if (field->is_extension()) {
        data_size += WireFormatLite::LengthDelimitedSize(
            message_reflection->GetExtensionSet(message).GetMessageByteSizeLong(
                field->number()));
        break;
      }
      data_size += WireFormatLite::MessageSize(
          message_reflection->GetMessage(message, field));
      break;
    }

#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        for (size_t j = 0; j < count; j++) {
          absl::Cord value = message_reflection->GetCord(message, field);
          data_size += WireFormatLite::StringSize(value);
        }
        break;
      }
      for (size_t j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}